

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O1

int __thiscall glu::TextureBuffer::init(TextureBuffer *this,EVP_PKEY_CTX *ctx)

{
  _func_int *p_Var1;
  bool bVar2;
  int iVar3;
  ContextType CVar4;
  deUint32 dVar5;
  int extraout_EAX;
  undefined4 extraout_var;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  size_t in_RCX;
  size_t in_RDX;
  size_t in_R8;
  void *in_R9;
  long lVar6;
  
  iVar3 = (*this->m_context->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  this_00 = ContextInfo::create(this->m_context);
  p_Var1 = this->m_context->_vptr_RenderContext[2];
  if (in_R8 == 0 && in_RCX == 0) {
    CVar4.super_ApiType.m_bits = (ApiType)(*p_Var1)();
    bVar2 = contextSupports(CVar4,(ApiType)0x133);
    if (bVar2) {
LAB_002ca3f1:
      de::ArrayBuffer<unsigned_char,_1UL,_1UL>::setStorage(&this->m_refBuffer,in_RDX);
      if (in_R9 != (void *)0x0) {
        memcpy((this->m_refBuffer).m_ptr,in_R9,(long)(int)in_RDX);
      }
      this->m_format = (deUint32)ctx;
      this->m_offset = in_RCX;
      this->m_size = in_R8;
      (**(code **)(lVar6 + 0x6f8))(1,&this->m_glTexture);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      checkError(dVar5,"glGenTextures() failed",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                 ,0x378);
      (**(code **)(lVar6 + 0x6c8))(1,&this->m_glBuffer);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      checkError(dVar5,"glGenBuffers() failed",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                 ,0x37b);
      (**(code **)(lVar6 + 0x40))(0x8c2a,this->m_glBuffer);
      (**(code **)(lVar6 + 0x150))(0x8c2a,(long)(int)(this->m_refBuffer).m_cap,in_R9,0x88e4);
      (**(code **)(lVar6 + 0x40))(0x8c2a,0);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      checkError(dVar5,"Failed to create buffer",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                 ,0x380);
      (**(code **)(lVar6 + 0xb8))(0x8c2a,this->m_glTexture);
      if (in_R8 == 0 && in_RCX == 0) {
        (**(code **)(lVar6 + 0x12f8))(0x8c2a,this->m_format,this->m_glBuffer);
      }
      else {
        (**(code **)(lVar6 + 0x1300))
                  (0x8c2a,this->m_format,this->m_glBuffer,this->m_offset,this->m_size);
      }
      (**(code **)(lVar6 + 0xb8))(0x8c2a,0);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      checkError(dVar5,"Failed to bind buffer to texture",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                 ,0x38a);
      if (this_00 != (ContextInfo *)0x0) {
        iVar3 = (*this_00->_vptr_ContextInfo[1])();
        return iVar3;
      }
      return extraout_EAX;
    }
    CVar4.super_ApiType.m_bits = (ApiType)(*this->m_context->_vptr_RenderContext[2])();
    bVar2 = contextSupports(CVar4,(ApiType)0x13);
    if (bVar2) {
      bVar2 = ContextInfo::isExtensionSupported(this_00,"GL_EXT_texture_buffer");
      if (bVar2) goto LAB_002ca3f1;
    }
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Texture buffers not supported","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x368);
  }
  else {
    CVar4.super_ApiType.m_bits = (ApiType)(*p_Var1)();
    bVar2 = contextSupports(CVar4,(ApiType)0x133);
    if (bVar2) {
      bVar2 = ContextInfo::isExtensionSupported(this_00,"GL_ARB_texture_buffer_range");
      if (bVar2) goto LAB_002ca3f1;
    }
    CVar4.super_ApiType.m_bits = (ApiType)(*this->m_context->_vptr_RenderContext[2])();
    bVar2 = contextSupports(CVar4,(ApiType)0x13);
    if (bVar2) {
      bVar2 = ContextInfo::isExtensionSupported(this_00,"GL_EXT_texture_buffer");
      if (bVar2) goto LAB_002ca3f1;
    }
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Ranged texture buffers not supported","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x35f);
  }
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureBuffer::init (deUint32 internalFormat, size_t bufferSize, size_t offset, size_t size, const void* data)
{
	const glw::Functions&		gl		= m_context.getFunctions();
	de::UniquePtr<ContextInfo>	info	(ContextInfo::create(m_context));

	if (offset != 0 || size != 0)
	{
		if (!(contextSupports(m_context.getType(), glu::ApiType(3, 3, glu::PROFILE_CORE)) && info->isExtensionSupported("GL_ARB_texture_buffer_range"))
			&& !(contextSupports(m_context.getType(), glu::ApiType(3, 1, glu::PROFILE_ES))
				&& info->isExtensionSupported("GL_EXT_texture_buffer")))
		{
			throw tcu::NotSupportedError("Ranged texture buffers not supported", "", __FILE__, __LINE__);
		}
	}
	else
	{
		if (!contextSupports(m_context.getType(), glu::ApiType(3, 3, glu::PROFILE_CORE))
			&& !(contextSupports(m_context.getType(), glu::ApiType(3, 1, glu::PROFILE_ES))
				&& info->isExtensionSupported("GL_EXT_texture_buffer")))
		{
			throw tcu::NotSupportedError("Texture buffers not supported", "", __FILE__, __LINE__);
		}
	}

	m_refBuffer.setStorage(bufferSize);
	if (data)
		deMemcpy(m_refBuffer.getPtr(), data, (int)bufferSize);

	m_format	= internalFormat;
	m_offset	= offset;
	m_size		= size;

	DE_ASSERT(size != 0 || offset == 0);

	{
		gl.genTextures(1, &m_glTexture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() failed");

		gl.genBuffers(1, &m_glBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed");

		gl.bindBuffer(GL_TEXTURE_BUFFER, m_glBuffer);
		gl.bufferData(GL_TEXTURE_BUFFER, (glw::GLsizei)m_refBuffer.size(), data, GL_STATIC_DRAW);
		gl.bindBuffer(GL_TEXTURE_BUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create buffer");

		gl.bindTexture(GL_TEXTURE_BUFFER, m_glTexture);

		if (offset != 0 || size != 0)
			gl.texBufferRange(GL_TEXTURE_BUFFER, m_format, m_glBuffer, (glw::GLintptr)m_offset, (glw::GLsizeiptr)m_size);
		else
			gl.texBuffer(GL_TEXTURE_BUFFER, m_format, m_glBuffer);

		gl.bindTexture(GL_TEXTURE_BUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to bind buffer to texture");
	}
}